

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void al_destroy_path(ALLEGRO_PATH *path)

{
  char *func;
  char *pcVar1;
  long *in_RDI;
  void *unaff_retaddr;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      al_ustr_free((ALLEGRO_USTR *)0x17c18e);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      al_ustr_free((ALLEGRO_USTR *)0x17c1b4);
      in_RDI[1] = 0;
    }
    uVar2 = 0;
    while( true ) {
      func = (char *)(ulong)uVar2;
      pcVar1 = (char *)_al_vector_size((_AL_VECTOR *)(in_RDI + 2));
      if (pcVar1 <= func) break;
      get_segment((ALLEGRO_PATH *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
                  (uint)((ulong)func >> 0x20));
      al_ustr_free((ALLEGRO_USTR *)0x17c201);
      uVar2 = uVar2 + 1;
    }
    _al_vector_free((_AL_VECTOR *)0x17c21c);
    if (in_RDI[6] != 0) {
      al_ustr_free((ALLEGRO_USTR *)0x17c236);
      in_RDI[6] = 0;
    }
    if (in_RDI[7] != 0) {
      al_ustr_free((ALLEGRO_USTR *)0x17c25d);
      in_RDI[7] = 0;
    }
    al_free_with_context
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0),func);
  }
  return;
}

Assistant:

void al_destroy_path(ALLEGRO_PATH *path)
{
   unsigned i;

   if (!path) {
      return;
   }

   if (path->drive) {
      al_ustr_free(path->drive);
      path->drive = NULL;
   }

   if (path->filename) {
      al_ustr_free(path->filename);
      path->filename = NULL;
   }

   for (i = 0; i < _al_vector_size(&path->segments); i++) {
      al_ustr_free(get_segment(path, i));
   }
   _al_vector_free(&path->segments);

   if (path->basename) {
      al_ustr_free(path->basename);
      path->basename = NULL;
   }

   if (path->full_string) {
      al_ustr_free(path->full_string);
      path->full_string = NULL;
   }

   al_free(path);
}